

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.h
# Opt level: O2

int secp256k1_musig_partial_sig_agg
              (secp256k1_context *ctx,uchar *sig64,secp256k1_musig_session *session,
              secp256k1_musig_partial_sig **partial_sigs,size_t n_sigs)

{
  secp256k1_scalar *a;
  int iVar1;
  void *pvVar2;
  char *pcVar3;
  size_t sVar4;
  secp256k1_scalar term;
  secp256k1_musig_session_internal session_i;
  
  if (sig64 == (uchar *)0x0) {
    pvVar2 = (ctx->illegal_callback).data;
    pcVar3 = "sig64 != NULL";
  }
  else if (session == (secp256k1_musig_session *)0x0) {
    pvVar2 = (ctx->illegal_callback).data;
    pcVar3 = "session != NULL";
  }
  else if (partial_sigs == (secp256k1_musig_partial_sig **)0x0) {
    pvVar2 = (ctx->illegal_callback).data;
    pcVar3 = "partial_sigs != NULL";
  }
  else {
    if (n_sigs != 0) {
      iVar1 = secp256k1_musig_session_load(ctx,&session_i,session);
      if (iVar1 == 0) {
        return 0;
      }
      a = &session_i.s_part;
      sVar4 = 0;
      while( true ) {
        if (n_sigs == sVar4) {
          secp256k1_scalar_get_b32(sig64 + 0x20,a);
          *(undefined8 *)(sig64 + 0x10) = session_i.fin_nonce._16_8_;
          *(undefined8 *)(sig64 + 0x18) = session_i.fin_nonce._24_8_;
          *(undefined8 *)sig64 = session_i.fin_nonce._0_8_;
          *(undefined8 *)(sig64 + 8) = session_i.fin_nonce._8_8_;
          return 1;
        }
        iVar1 = secp256k1_musig_partial_sig_load(ctx,&term,partial_sigs[sVar4]);
        if (iVar1 == 0) break;
        secp256k1_scalar_add(a,a,&term);
        sVar4 = sVar4 + 1;
      }
      return 0;
    }
    pvVar2 = (ctx->illegal_callback).data;
    pcVar3 = "n_sigs > 0";
  }
  (*(ctx->illegal_callback).fn)(pcVar3,pvVar2);
  return 0;
}

Assistant:

int secp256k1_musig_partial_sig_agg(const secp256k1_context* ctx, unsigned char *sig64, const secp256k1_musig_session *session, const secp256k1_musig_partial_sig * const* partial_sigs, size_t n_sigs) {
    size_t i;
    secp256k1_musig_session_internal session_i;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(sig64 != NULL);
    ARG_CHECK(session != NULL);
    ARG_CHECK(partial_sigs != NULL);
    ARG_CHECK(n_sigs > 0);

    if (!secp256k1_musig_session_load(ctx, &session_i, session)) {
        return 0;
    }
    for (i = 0; i < n_sigs; i++) {
        secp256k1_scalar term;
        if (!secp256k1_musig_partial_sig_load(ctx, &term, partial_sigs[i])) {
            return 0;
        }
        secp256k1_scalar_add(&session_i.s_part, &session_i.s_part, &term);
    }
    secp256k1_scalar_get_b32(&sig64[32], &session_i.s_part);
    memcpy(&sig64[0], session_i.fin_nonce, 32);
    return 1;
}